

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall DSBarInfo::ShowPop(DSBarInfo *this,int popnum)

{
  int iVar1;
  SBarInfo *pSVar2;
  bool bVar3;
  
  DBaseStatusBar::ShowPop(&this->super_DBaseStatusBar,popnum);
  iVar1 = this->currentPopup;
  if (iVar1 == popnum) {
    this->pendingPopup = 0;
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    this->pendingPopup = popnum;
    if (iVar1 == 0) {
      this->currentPopup = popnum;
      this->pendingPopup = 0;
      bVar3 = true;
      if (popnum == 0) {
        return;
      }
      goto LAB_004c01e1;
    }
  }
  bVar3 = false;
  popnum = iVar1;
LAB_004c01e1:
  pSVar2 = this->script;
  pSVar2->popups[(long)popnum + -1].opened = bVar3;
  pSVar2->popups[(long)popnum + -1].moving = true;
  return;
}

Assistant:

void ShowPop(int popnum)
	{
		DBaseStatusBar::ShowPop(popnum);
		if(popnum != currentPopup)
		{
			pendingPopup = popnum;
		}
		else
			pendingPopup = POP_None;
		if(currentPopup != POP_None)
			script->popups[currentPopup-1].close();
		else
		{
			currentPopup = pendingPopup;
			pendingPopup = POP_None;
			if(currentPopup != POP_None)
				script->popups[currentPopup-1].open();
		}
	}